

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QList<QAccessibleInterface_*> * __thiscall QAccessibleList::selectedCells(QAccessibleList *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QItemSelectionModel *pQVar4;
  const_iterator o;
  QModelIndex *this_00;
  long *in_RSI;
  QListView *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  int modelColumn;
  QListView *listView;
  QAbstractItemView *theView;
  QList<QAccessibleInterface_*> *cells;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList selectedIndexes;
  parameter_type in_stack_ffffffffffffff58;
  QListView *this_01;
  undefined4 in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffffc8;
  int local_2c;
  qsizetype local_28;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QAccessibleTable::view((QAccessibleTable *)0x7f8852);
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
       = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
    super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<QAccessibleInterface_*>::QList((QList<QAccessibleInterface_*> *)0x7f8886);
  QAccessibleTable::view((QAccessibleTable *)0x7f8890);
  pQVar4 = QAbstractItemView::selectionModel(&this_01->super_QAbstractItemView);
  if ((pQVar4 != (QItemSelectionModel *)0x0) &&
     (iVar2 = (**(code **)(*in_RSI + 0x58))(), iVar2 != 0)) {
    qobject_cast<QListView_const*>((QObject *)0x7f88ca);
    iVar2 = QListView::modelColumn(this_01);
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel(&this_01->super_QAbstractItemView);
    QItemSelectionModel::selectedIndexes();
    local_28 = QList<QModelIndex>::size(&local_20);
    local_2c = (**(code **)(*in_RSI + 0x60))();
    qMin<long_long,int>(&local_28,&local_2c);
    QList<QAccessibleInterface_*>::reserve
              ((QList<QAccessibleInterface_*> *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
               (qsizetype)in_stack_ffffffffffffffc8.i);
    QList<QModelIndex>::begin((QList<QModelIndex> *)this_01);
    o = QList<QModelIndex>::end((QList<QModelIndex> *)this_01);
    while (bVar1 = QList<QModelIndex>::const_iterator::operator!=
                             ((const_iterator *)&stack0xffffffffffffffc8,o), bVar1) {
      this_00 = QList<QModelIndex>::const_iterator::operator*
                          ((const_iterator *)&stack0xffffffffffffffc8);
      iVar3 = QModelIndex::column(this_00);
      if (iVar3 == iVar2) {
        iVar3 = QModelIndex::row(this_00);
        (**(code **)(*in_RSI + 0x100))(in_RSI,iVar3);
        QList<QAccessibleInterface_*>::append
                  ((QList<QAccessibleInterface_*> *)0x7f8a2d,in_stack_ffffffffffffff58);
      }
      QList<QModelIndex>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffc8);
    }
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7f8a58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QAccessibleInterface_*> *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAccessibleInterface *> QAccessibleList::selectedCells() const
{
    QAbstractItemView *theView = view();
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel() || columnCount() == 0)
        return cells;
    const QListView *listView = qobject_cast<const QListView*>(theView);
    const int modelColumn = listView->modelColumn();
    const QModelIndexList selectedIndexes = theView->selectionModel()->selectedIndexes();
    cells.reserve(qMin(selectedIndexes.size(), rowCount()));
    for (const QModelIndex &index : selectedIndexes)
        if (index.column() == modelColumn) {
            cells.append(child(index.row()));
        }
    return cells;
}